

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringPool.hpp
# Opt level: O1

Char * __thiscall Diligent::StringPool::Allocate(StringPool *this,size_t Length)

{
  Char *pCVar1;
  string msg;
  string local_38;
  
  if (this->m_pBuffer + this->m_ReservedSize < this->m_pCurrPtr + Length) {
    FormatString<char[31]>(&local_38,(char (*) [31])"Not enough space in the buffer");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/StringPool.hpp"
               ,0x76);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  pCVar1 = this->m_pCurrPtr;
  this->m_pCurrPtr = pCVar1 + Length;
  return pCVar1;
}

Assistant:

Char* Allocate(size_t Length)
    {
        VERIFY(m_pCurrPtr + Length <= m_pBuffer + m_ReservedSize, "Not enough space in the buffer");
        auto* Ptr = m_pCurrPtr;
        m_pCurrPtr += Length;
        return Ptr;
    }